

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O3

void __thiscall GetOpt::GetOpt_pp::TokensDeleter::~TokensDeleter(TokensDeleter *this)

{
  pointer pcVar1;
  Token *pTVar2;
  Token *pTVar3;
  
  pTVar3 = *this->_first;
  while (pTVar3 != (Token *)0x0) {
    pcVar1 = (pTVar3->value)._M_dataplus._M_p;
    pTVar2 = pTVar3->next;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(pTVar3->value).field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(pTVar3);
    pTVar3 = pTVar2;
  }
  return;
}

Assistant:

GETOPT_INLINE GetOpt_pp::TokensDeleter::~TokensDeleter()
{
    Token* next;
    Token* current(_first);
    while (current != NULL)
    {
        next = current->next;
        delete current;
        current = next;
    }
}